

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestPartResult
          (StreamingListener *this,TestPartResult *test_part_result)

{
  int iVar1;
  TestPartResult *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *file_name;
  string *in_stack_fffffffffffffeb8;
  TestPartResult *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_130 [24];
  int *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff28;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  char *local_18;
  TestPartResult *local_10;
  
  local_10 = in_RSI;
  local_18 = TestPartResult::file_name(in_stack_fffffffffffffec0);
  if (local_18 == (char *)0x0) {
    local_18 = "";
  }
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffff28;
  UrlEncode_abi_cxx11_(in_stack_ffffffffffffff28);
  std::operator+((char *)in_RDI,__rhs);
  std::operator+(in_RDI,(char *)__rhs);
  iVar1 = TestPartResult::line_number(local_10);
  StreamableToString<int>(in_stack_fffffffffffffee8);
  std::operator+(in_stack_fffffffffffffef8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar1,in_stack_fffffffffffffef0));
  std::operator+(in_RDI,(char *)__rhs);
  TestPartResult::message((TestPartResult *)0x1102d2c);
  UrlEncode_abi_cxx11_(in_stack_ffffffffffffff28);
  std::operator+(in_stack_fffffffffffffef8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar1,in_stack_fffffffffffffef0));
  SendLn((StreamingListener *)__rhs,in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
  return;
}

Assistant:

void OnTestPartResult(const TestPartResult& test_part_result) override {
    const char* file_name = test_part_result.file_name();
    if (file_name == nullptr) file_name = "";
    SendLn("event=TestPartResult&file=" + UrlEncode(file_name) +
           "&line=" + StreamableToString(test_part_result.line_number()) +
           "&message=" + UrlEncode(test_part_result.message()));
  }